

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

void __thiscall
boost::function1<void,boost::unit_test::basic_cstring<char_const>>::
assign_to<boost::unit_test::runtime_config::(anonymous_namespace)::register_parameters(boost::runtime::parameters_store&)::__0>
          (void *param_1)

{
  bool bVar1;
  size_t value;
  
  bVar1 = detail::function::basic_vtable1<void,boost::unit_test::basic_cstring<char_const>>::
          assign_to<boost::unit_test::runtime_config::(anonymous_namespace)::register_parameters(boost::runtime::parameters_store&)::__0>
                    (&function1<void,_boost::unit_test::basic_cstring<const_char>_>::
                      assign_to<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/test/impl/unit_test_parameters.ipp:134:24)>
                      ::stored_vtable,(long)param_1 + 8);
  if (bVar1) {
    *(undefined8 *)param_1 = 0x301ce1;
  }
  else {
    *(undefined8 *)param_1 = 0;
  }
  return;
}

Assistant:

void assign_to(Functor f)
    {
      using boost::detail::function::vtable_base;

      typedef typename boost::detail::function::get_function_tag<Functor>::type tag;
      typedef boost::detail::function::BOOST_FUNCTION_GET_INVOKER<tag> get_invoker;
      typedef typename get_invoker::
                         template apply<Functor, R BOOST_FUNCTION_COMMA
                        BOOST_FUNCTION_TEMPLATE_ARGS>
        handler_type;

      typedef typename handler_type::invoker_type invoker_type;
      typedef typename handler_type::manager_type manager_type;

      // Note: it is extremely important that this initialization use
      // static initialization. Otherwise, we will have a race
      // condition here in multi-threaded code. See
      // http://thread.gmane.org/gmane.comp.lib.boost.devel/164902/.
      static const vtable_type stored_vtable =
        { { &manager_type::manage }, &invoker_type::invoke };

      if (stored_vtable.assign_to(f, functor)) {
        std::size_t value = reinterpret_cast<std::size_t>(&stored_vtable.base);
        // coverity[pointless_expression]: suppress coverity warnings on apparant if(const).
        if (boost::has_trivial_copy_constructor<Functor>::value &&
            boost::has_trivial_destructor<Functor>::value &&
            boost::detail::function::function_allows_small_object_optimization<Functor>::value)
          value |= static_cast<std::size_t>(0x01);
        vtable = reinterpret_cast<boost::detail::function::vtable_base *>(value);
      } else
        vtable = 0;
    }